

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O2

string * __thiscall
Catch::Generators::IGenerator<std::tuple<long_double,long_double,long_double>>::
stringifyImpl_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  (**(code **)(*this + 0x20))(this);
  StringRef::operator_cast_to_string
            (__return_storage_ptr__,(StringRef *)Catch::Detail::unprintableString);
  return __return_storage_ptr__;
}

Assistant:

std::string stringifyImpl() const override {
            return ::Catch::Detail::stringify( get() );
        }